

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSFieldIndex_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  Descriptor *pDVar1;
  long lVar2;
  Type TVar3;
  Descriptor *pDVar4;
  int i;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar5;
  uint uVar6;
  long lVar7;
  
  i = (int)field;
  pDVar1 = *(Descriptor **)(this + 0x58);
  lVar2 = *(long *)(pDVar1 + 0x18);
  if ((lVar2 != 0) && (0 < *(int *)(lVar2 + 0x2c))) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      TVar3 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(lVar2 + 0x30) + lVar7));
      i = extraout_EDX;
      if (TVar3 == TYPE_GROUP) {
        pDVar4 = FieldDescriptor::message_type((FieldDescriptor *)(*(long *)(lVar2 + 0x30) + lVar7))
        ;
        i = extraout_EDX_00;
        if (pDVar4 == pDVar1) {
          uVar6 = *(int *)(this + 0x38) - *(int *)(*(long *)(lVar2 + 0x30) + 0x38 + lVar7);
          goto LAB_00222faf;
        }
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar5 < *(int *)(lVar2 + 0x2c));
  }
  uVar6 = *(uint *)(this + 0x38);
LAB_00222faf:
  SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)uVar6,i);
  return __return_storage_ptr__;
}

Assistant:

string JSFieldIndex(const FieldDescriptor* field) {
  // Determine whether this field is a member of a group. Group fields are a bit
  // wonky: their "containing type" is a message type created just for the
  // group, and that type's parent type has a field with the group-message type
  // as its message type and TYPE_GROUP as its field type. For such fields, the
  // index we use is relative to the field number of the group submessage field.
  // For all other fields, we just use the field number.
  const Descriptor* containing_type = field->containing_type();
  const Descriptor* parent_type = containing_type->containing_type();
  if (parent_type != NULL) {
    for (int i = 0; i < parent_type->field_count(); i++) {
      if (parent_type->field(i)->type() == FieldDescriptor::TYPE_GROUP &&
          parent_type->field(i)->message_type() == containing_type) {
        return SimpleItoa(field->number() - parent_type->field(i)->number());
      }
    }
  }
  return SimpleItoa(field->number());
}